

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

uint8_t * xml_easy_name(xml_node *node)

{
  xml_string *pxVar1;
  size_t __n;
  uint8_t *__dest;
  
  if ((node == (xml_node *)0x0) || (pxVar1 = node->name, pxVar1 == (xml_string *)0x0)) {
    __dest = (uint8_t *)0x0;
  }
  else {
    __n = pxVar1->length;
    __dest = (uint8_t *)calloc(__n + 1,1);
    memcpy(__dest,pxVar1->buffer,__n);
    __dest[__n] = '\0';
  }
  return __dest;
}

Assistant:

uint8_t* xml_easy_name(struct xml_node* node) {
	if (!node) {
		return 0;
	}

	return xml_string_clone(xml_node_name(node));
}